

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_set_rate_ratio(ma_linear_resampler *pResampler,float ratioInOut)

{
  ma_uint32 sampleRateIn;
  ma_uint32 d;
  ma_uint32 n;
  float ratioInOut_local;
  ma_linear_resampler *pResampler_local;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    pResampler_local._4_4_ = MA_INVALID_ARGS;
  }
  else if (0.0 < ratioInOut) {
    sampleRateIn = (ma_uint32)(long)(ratioInOut * 1000.0);
    if (sampleRateIn == 0) {
      pResampler_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      if (sampleRateIn == 0) {
        __assert_fail("n != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x98af,
                      "ma_result ma_linear_resampler_set_rate_ratio(ma_linear_resampler *, float)");
      }
      pResampler_local._4_4_ = ma_linear_resampler_set_rate(pResampler,sampleRateIn,1000);
    }
  }
  else {
    pResampler_local._4_4_ = MA_INVALID_ARGS;
  }
  return pResampler_local._4_4_;
}

Assistant:

MA_API ma_result ma_linear_resampler_set_rate_ratio(ma_linear_resampler* pResampler, float ratioInOut)
{
    ma_uint32 n;
    ma_uint32 d;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (ratioInOut <= 0) {
        return MA_INVALID_ARGS;
    }

    d = 1000;
    n = (ma_uint32)(ratioInOut * d);

    if (n == 0) {
        return MA_INVALID_ARGS; /* Ratio too small. */
    }

    MA_ASSERT(n != 0);

    return ma_linear_resampler_set_rate(pResampler, n, d);
}